

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_internal.h
# Opt level: O0

void ZSTD_wildcopy(void *dst,void *src,ptrdiff_t length)

{
  long in_RDX;
  void *in_RSI;
  void *in_RDI;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  undefined8 local_28;
  undefined8 local_20;
  
  local_28 = in_RDI;
  local_20 = in_RSI;
  do {
    ZSTD_copy8(local_28,local_20);
    local_28 = (void *)((long)local_28 + 8);
    local_20 = (void *)((long)local_20 + 8);
  } while (local_28 < (void *)((long)in_RDI + in_RDX));
  return;
}

Assistant:

MEM_STATIC void ZSTD_wildcopy(void* dst, const void* src, ptrdiff_t length)
{
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    BYTE* const oend = op + length;
    do
        COPY8(op, ip)
    while (op < oend);
}